

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::kolikBitu(Sudoku *this,int x,int y)

{
  int local_20;
  uint local_1c;
  uint akum;
  uint zakazano;
  int y_local;
  int x_local;
  Sudoku *this_local;
  
  local_20 = 0;
  for (local_1c = (this->s).radky[y] | (this->s).sloupce[x] | (this->s).ctverce[x / 3][y / 3];
      local_1c != 0; local_1c = local_1c >> 1) {
    local_20 = (local_1c & 1) + local_20;
  }
  return local_20;
}

Assistant:

int Sudoku::kolikBitu (int x, int y)
{
  // sjednoceni mnozin - zjistime co je zakazano pouzit na nasi pozci
  unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
  // akumulator
  unsigned int akum;
  // provadime bitovy posun doprava dokud neni zakazano = 0
  for (akum = 0; zakazano; zakazano >>= 1)
  {
    // kdyz je na nejnizsim bitu 1, zvysime akumulator
    akum += zakazano & 1;
  }
  return akum; // vratime kolik bitu je nastaveno
}